

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ParseURLProtocol(string *URL,string *protocol,string *dataglom)

{
  bool bVar1;
  string local_148;
  string local_128;
  undefined4 local_108;
  undefined1 local_f8 [8];
  RegularExpression urlRe;
  string *dataglom_local;
  string *protocol_local;
  string *URL_local;
  
  urlRe.searchstring = (char *)dataglom;
  RegularExpression::RegularExpression((RegularExpression *)local_f8,"([a-zA-Z0-9]*)://(.*)");
  bVar1 = RegularExpression::find((RegularExpression *)local_f8,URL);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_(&local_128,(RegularExpression *)local_f8,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    RegularExpression::match_abi_cxx11_(&local_148,(RegularExpression *)local_f8,2);
    std::__cxx11::string::operator=((string *)urlRe.searchstring,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
  }
  local_108 = 1;
  RegularExpression::~RegularExpression((RegularExpression *)local_f8);
  return bVar1;
}

Assistant:

bool SystemTools::ParseURLProtocol( const kwsys_stl::string& URL,
                                    kwsys_stl::string& protocol,
                                    kwsys_stl::string& dataglom )
{
  // match 0 entire url
  // match 1 protocol
  // match 2 dataglom following protocol://
  kwsys::RegularExpression urlRe( VTK_URL_PROTOCOL_REGEX );

  if ( ! urlRe.find( URL ) ) return false;

  protocol = urlRe.match( 1 );
  dataglom = urlRe.match( 2 );

  return true;
}